

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O1

void __thiscall CNscPStackEntry::~CNscPStackEntry(CNscPStackEntry *this)

{
  NscSymbolFence *pNVar1;
  anon_union_8_2_ecfd7102_for_NscSymbolFence_9 aVar2;
  uchar *puVar3;
  char *pcVar4;
  CNscPStackEntry *pCVar5;
  CNwnDoubleLinkList *pCVar6;
  
  pNVar1 = this->m_pFence;
  if (pNVar1 != (NscSymbolFence *)0x0) {
    if ((pNVar1->nFenceType == NscFenceType_Switch) &&
       (aVar2 = pNVar1->field_9, aVar2 != (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)0x0)) {
      if (*(void **)aVar2 != (void *)0x0) {
        operator_delete(*(void **)aVar2);
      }
      operator_delete((void *)aVar2);
    }
    if (this->m_pFence != (NscSymbolFence *)0x0) {
      operator_delete(this->m_pFence);
    }
  }
  puVar3 = this->m_pauchData;
  if (puVar3 != (uchar *)0x0 && puVar3 != this->m_auchDataFast) {
    operator_delete__(puVar3);
  }
  pcVar4 = this->m_pszId;
  if (pcVar4 != (char *)0x0 && pcVar4 != this->m_achIdFast) {
    operator_delete__(pcVar4);
  }
  pCVar5 = (CNscPStackEntry *)(this->m_link).m_pNext;
  if (pCVar5 != this) {
    pCVar6 = (this->m_link).m_pPrev;
    (pCVar5->m_link).m_pPrev = pCVar6;
    pCVar6->m_pNext = (CNwnDoubleLinkList *)pCVar5;
    (this->m_link).m_pNext = &this->m_link;
    (this->m_link).m_pPrev = &this->m_link;
  }
  return;
}

Assistant:

CNscPStackEntry::~CNscPStackEntry ()
{

	//
	// Delete any of our allocated variables
	//

	if (m_pFence)
	{
		if (m_pFence ->nFenceType == NscFenceType_Switch)
			delete m_pFence ->pSwitchCasesUsed;
		delete m_pFence;
	}
	if (m_pauchData != m_auchDataFast)
		delete [] m_pauchData;
	if (m_pszId != m_achIdFast)
		delete [] m_pszId;
}